

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Boundary_matrix.h
# Opt level: O3

void __thiscall
Gudhi::persistence_matrix::
Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true>_>_>
::_container_insert(Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true>_>_>
                    *this,Column *column,Index pos)

{
  Column_support *this_00;
  pointer pEVar1;
  node_ptr to_erase;
  pointer p;
  Index local_3c;
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true>_>_>
  local_38;
  
  local_38.entryPool_ = &this->colSettings_->entryConstructor;
  local_38.super_Column_dimension_option.dim_ = (column->super_Column_dimension_option).dim_;
  this_00 = &local_38.column_;
  local_38.operators_ = (Field_operators *)0x0;
  if ((Column_settings *)local_38.entryPool_ == (Column_settings *)0x0) {
    local_38.operators_ = column->operators_;
  }
  if ((Column_settings *)local_38.entryPool_ == (Column_settings *)0x0) {
    local_38.entryPool_ = column->entryPool_;
  }
  local_3c = pos;
  local_38.column_.super_type.data_.root_plus_size_.m_header.super_node.next_ = (node_ptr)this_00;
  local_38.column_.super_type.data_.root_plus_size_.m_header.super_node.prev_ = (node_ptr)this_00;
  boost::intrusive::
  list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,true>>>,boost::intrusive::list_node_traits<void*>,(boost::intrusive::link_mode_type)1,Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,true>>::Matrix_column_tag,1u>,unsigned_long,false,void>
  ::
  clone_from<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,true>>>::New_cloner,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,true>>>::Delete_disposer>
            ((list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,true>>>,boost::intrusive::list_node_traits<void*>,(boost::intrusive::link_mode_type)1,Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,true>>::Matrix_column_tag,1u>,unsigned_long,false,void>
              *)this_00,&(column->column_).super_type,(New_cloner)local_38.entryPool_,&local_38);
  std::__detail::
  _Insert_base<unsigned_int,std::pair<unsigned_int_const,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,true>>>>,std::allocator<std::pair<unsigned_int_const,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,true>>>>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  try_emplace<unsigned_int_const&,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,true>>>>
            ((_Insert_base<unsigned_int,std::pair<unsigned_int_const,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,true>>>>,std::allocator<std::pair<unsigned_int_const,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,true>>>>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&this->matrix_,(const_iterator)0x0,&local_3c,&local_38);
  p = (pointer)local_38.column_.super_type.data_.root_plus_size_.m_header.super_node.next_;
  while (p != (pointer)this_00) {
    pEVar1 = (pointer)(p->super_Column_hook).super_type.super_type.super_list_node<void_*>.next_;
    (p->super_Column_hook).super_type.super_type.super_list_node<void_*>.next_ = (node_ptr)0x0;
    (p->super_Column_hook).super_type.super_type.super_list_node<void_*>.prev_ = (node_ptr)0x0;
    Simple_object_pool<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true>_>_>_>
    ::destroy(&(local_38.entryPool_)->entryPool_,p);
    p = pEVar1;
  }
  return;
}

Assistant:

inline void Boundary_matrix<Master_matrix>::_container_insert(const Column& column, [[maybe_unused]] Index pos)
{
  if constexpr (Master_matrix::Option_list::has_map_column_container) {
    if constexpr (Master_matrix::Option_list::has_row_access) {
      matrix_.try_emplace(pos, Column(column, column.get_column_index(), RA_opt::rows_, colSettings_));
    } else {
      matrix_.try_emplace(pos, Column(column, colSettings_));
    }
  } else {
    if constexpr (Master_matrix::Option_list::has_row_access) {
      matrix_.emplace_back(column, column.get_column_index(), RA_opt::rows_, colSettings_);
    } else {
      matrix_.emplace_back(column, colSettings_);
    }
  }
}